

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.hpp
# Opt level: O2

FilePath * __thiscall de::FilePath::join(FilePath *this,FilePath *b)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar1 = std::operator==(&this->m_path,"");
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)this);
  }
  else {
    std::operator+(&bStack_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   separator_abi_cxx11_,&b->m_path);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  return this;
}

Assistant:

inline FilePath& FilePath::join (const FilePath& b)
{
	if (m_path == "")
		m_path = b.m_path;
	else
		m_path += separator + b.m_path;
	return *this;
}